

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uint-bset.c
# Opt level: O3

_Bool Curl_uint_bset_first(uint_bset *bset,uint *pfirst)

{
  long lVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  curl_uint64_t cVar5;
  ulong uVar6;
  _Bool _Var7;
  
  uVar4 = (ulong)bset->nslots;
  uVar3 = 0;
  uVar2 = 0xffffffff;
  if (uVar4 == 0) {
LAB_0015efa1:
    _Var7 = false;
  }
  else {
    cVar5 = *bset->slots;
    _Var7 = true;
    if (cVar5 == 0) {
      uVar3 = 0;
      uVar6 = 0;
      do {
        if (uVar4 - 1 == uVar6) goto LAB_0015efa1;
        cVar5 = bset->slots[uVar6 + 1];
        uVar3 = uVar3 + 0x40;
        uVar6 = uVar6 + 1;
      } while (cVar5 == 0);
      _Var7 = uVar6 < uVar4;
    }
    lVar1 = 0;
    if (cVar5 != 0) {
      for (; (cVar5 >> lVar1 & 1) == 0; lVar1 = lVar1 + 1) {
      }
    }
    uVar2 = (uint)lVar1 | uVar3;
  }
  *pfirst = uVar2;
  return _Var7;
}

Assistant:

bool Curl_uint_bset_first(struct uint_bset *bset, unsigned int *pfirst)
{
  unsigned int i;
  for(i = 0; i < bset->nslots; ++i) {
    if(bset->slots[i]) {
      *pfirst = (i * 64) + CURL_CTZ64(bset->slots[i]);
      return TRUE;
    }
  }
  *pfirst = UINT_MAX; /* a value we cannot store */
  return FALSE;
}